

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

bool __thiscall DIntermissionController::NextPage(DIntermissionController *this)

{
  uint uVar1;
  FIntermissionDescriptor *pFVar2;
  FIntermissionAction *pFVar3;
  PClass *this_00;
  Node *pNVar4;
  undefined8 in_RAX;
  DIntermissionScreen *pDVar5;
  byte unaff_BPL;
  bool bVar6;
  Node *pNVar7;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if ((this->mIndex ==
       (this->mDesc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count) &&
     ((this->mDesc->mLink).Index == 0)) {
LAB_00301d80:
    unaff_BPL = 0;
    goto LAB_00301d82;
  }
  pDVar5 = (this->mScreen).field_0.p;
  if (pDVar5 == (DIntermissionScreen *)0x0) {
LAB_00301c71:
    bVar6 = false;
  }
  else {
    if (((pDVar5->super_DObject).ObjectFlags & 0x20) != 0) {
      (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
      goto LAB_00301c71;
    }
    pDVar5 = (this->mScreen).field_0.p;
    bVar6 = pDVar5->mFlatfill;
    local_34 = (pDVar5->mBackground).texnum;
    (*(pDVar5->super_DObject)._vptr_DObject[4])();
  }
  do {
    while( true ) {
      uVar1 = this->mIndex;
      pFVar2 = this->mDesc;
      if (uVar1 < (pFVar2->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.
                  Count) break;
      uVar1 = (pFVar2->mLink).Index;
      if (uVar1 == 0) goto LAB_00301d80;
      pNVar4 = IntermissionDescriptors.Nodes + (IntermissionDescriptors.Size - 1 & uVar1);
      do {
        pNVar7 = pNVar4;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pNVar7 = (Node *)0x0;
          break;
        }
        pNVar4 = pNVar7->Next;
      } while ((pNVar7->Pair).Key.Index != uVar1);
      if (pNVar7 == (Node *)0x0) goto LAB_00301d80;
      if (this->mDeleteDesc == true) {
        TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
                  (&pFVar2->mActions);
        operator_delete(pFVar2,0x18);
      }
      this->mDeleteDesc = false;
      this->mIndex = 0;
      this->mDesc = (pNVar7->Pair).Value;
      if (pNVar7 == (Node *)0x0) goto LAB_00301d80;
    }
    this->mIndex = uVar1 + 1;
    pFVar3 = (pFVar2->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array
             [(int)uVar1];
    this_00 = pFVar3->mClass;
    if (this_00 == (PClass *)0xffffffffffffffff) {
      wipegamestate = *(gamestate_t *)&pFVar3[1]._vptr_FIntermissionAction;
    }
    else if (this_00 == (PClass *)0xfffffffffffffffe) {
      (*(this->super_DObject)._vptr_DObject[4])(this);
      D_StartTitle();
      unaff_BPL = 0;
    }
    else {
      pDVar5 = (DIntermissionScreen *)PClass::CreateNew(this_00);
      (this->mScreen).field_0.p = pDVar5;
      (pDVar5->mBackground).texnum = local_34;
      pDVar5->mFlatfill = bVar6;
      pDVar5 = (this->mScreen).field_0.p;
      (*(pDVar5->super_DObject)._vptr_DObject[7])(pDVar5,pFVar3,(ulong)this->mFirst);
      this->mFirst = false;
      unaff_BPL = 1;
    }
  } while (this_00 == (PClass *)0xffffffffffffffff);
LAB_00301d82:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool DIntermissionController::NextPage ()
{
	FTextureID bg;
	bool fill = false;

	if (mIndex == (int)mDesc->mActions.Size() && mDesc->mLink == NAME_None)
	{
		// last page
		return false;
	}

	if (mScreen != NULL)
	{
		bg = mScreen->GetBackground(&fill);
		mScreen->Destroy();
	}
again:
	while ((unsigned)mIndex < mDesc->mActions.Size())
	{
		FIntermissionAction *action = mDesc->mActions[mIndex++];
		if (action->mClass == WIPER_ID)
		{
			wipegamestate = static_cast<FIntermissionActionWiper*>(action)->mWipeType;
		}
		else if (action->mClass == TITLE_ID)
		{
			Destroy();
			D_StartTitle ();
			return false;
		}
		else
		{
			// create page here
			mScreen = (DIntermissionScreen*)action->mClass->CreateNew();
			mScreen->SetBackground(bg, fill);	// copy last screen's background before initializing
			mScreen->Init(action, mFirst);
			mFirst = false;
			return true;
		}
	}
	if (mDesc->mLink != NAME_None)
	{
		FIntermissionDescriptor **pDesc = IntermissionDescriptors.CheckKey(mDesc->mLink);
		if (pDesc != NULL)
		{
			if (mDeleteDesc) delete mDesc;
			mDeleteDesc = false;
			mIndex = 0;
			mDesc = *pDesc;
			goto again;
		}
	}
	return false;
}